

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_ai.cpp
# Opt level: O3

void __thiscall cpp_client::Base_ai::invalid(Base_ai *this,string *message)

{
  undefined8 in_RAX;
  ostream *poVar1;
  ostream *poVar2;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\x1b[",2);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x21);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"m",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Invalid: ",9);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,(message->_M_dataplus)._M_p,message->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\x1b[",2);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar1,0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"m",1);
  uStack_28 = CONCAT17(10,(undefined7)uStack_28);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)((long)&uStack_28 + 7),1);
  return;
}

Assistant:

void Base_ai::invalid(const std::string& message)
{
   std::cerr << sgr::text_yellow << "Invalid: " << message << sgr::reset << '\n';
}